

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O3

int si9ma::DP::find_way_recursive(int *arr,int length,int start,int aim,int step)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar2 = 0;
  uVar3 = 0;
  if (((start | aim) < 0 || length <= aim) || arr == (int *)0x0) {
LAB_0010e4d7:
    return iVar2 + uVar3;
  }
  iVar2 = 0;
  uVar3 = 0;
LAB_0010e454:
  iVar4 = -step;
  do {
    iVar4 = iVar4 + 1;
    if (length <= start) goto LAB_0010e4d7;
    if (iVar4 == 1) {
      uVar3 = (uint)(start == aim);
      goto LAB_0010e4d7;
    }
    if (start == 0) {
      uVar1 = 1;
    }
    else {
      uVar1 = length - 2;
      if (length - 1U != start) break;
    }
    start = uVar1;
    if (start < 0) goto LAB_0010e4d7;
  } while( true );
  step = -iVar4;
  iVar4 = find_way_recursive(arr,length,start + 1,aim,step);
  iVar2 = iVar2 + iVar4;
  if (((length <= aim) || (start = start - 1, (start | aim) < 0)) || (arr == (int *)0x0))
  goto LAB_0010e4d7;
  goto LAB_0010e454;
}

Assistant:

int DP::find_way_recursive(const int *arr, int length,int start, int aim, int step) {
        if(arr == nullptr || start < 0 || start >= length || aim < 0 || aim >= length)
            return 0;

        if(step == 0)
            return start == aim;

        if(start == 0)
            return find_way_recursive(arr,length,1,aim,step - 1);

        if(start == length - 1)
            return find_way_recursive(arr,length,length - 2,aim,step - 1);

        return find_way_recursive(arr,length,start + 1,aim,step - 1)
               + find_way_recursive(arr,length,start - 1,aim,step - 1);
    }